

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O1

void init_agency(agency_t *record)

{
  record->id[0] = '\0';
  record->name[0] = '\0';
  record->url[0] = '\0';
  record->timezone[0] = '\0';
  record->lang[0] = '\0';
  record->phone[0] = '\0';
  record->fare_url[0] = '\0';
  record->email[0] = '\0';
  return;
}

Assistant:

void init_agency(agency_t *record) {
    strcpy(record->id, "");
    strcpy(record->name, "");
    strcpy(record->url, "");
    strcpy(record->timezone, "");
    strcpy(record->lang, "");
    strcpy(record->phone, "");
    strcpy(record->fare_url, "");
    strcpy(record->email, "");
}